

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall
higan::HttpServer::OnNewMessage(HttpServer *this,TcpConnectionPtr *connection,Buffer *buffer)

{
  Buffer *connection_00;
  bool bVar1;
  element_type *peVar2;
  any *__any;
  HttpContext *this_00;
  HttpRequest *request;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  bool parse_ok;
  allocator<char> local_49;
  string local_48;
  HttpContext *local_28;
  HttpContext *context;
  Buffer *buffer_local;
  TcpConnectionPtr *connection_local;
  HttpServer *this_local;
  
  context = (HttpContext *)buffer;
  buffer_local = (Buffer *)connection;
  connection_local = (TcpConnectionPtr *)this;
  peVar2 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)connection);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"HttpContext",&local_49);
  __any = TcpConnection::GetContext(peVar2,&local_48);
  this_00 = std::any_cast<higan::HttpContext>(__any);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = this_00;
  local_5d = HttpContext::ParseRequest(this_00,(Buffer *)context);
  if (!(bool)local_5d) {
    peVar2 = std::
             __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)buffer_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"HTTP/1.1 400 Bad Request\r\n\r\n",&local_81);
    TcpConnection::Send(peVar2,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    peVar2 = std::
             __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)buffer_local);
    TcpConnection::DestroyConnection(peVar2);
  }
  bVar1 = HttpContext::ParseOver(local_28);
  connection_00 = buffer_local;
  if (bVar1) {
    request = HttpContext::GetRequest(local_28);
    OnHttpRequest(this,(TcpConnectionPtr *)connection_00,request);
    HttpContext::Reset(local_28);
  }
  return;
}

Assistant:

void HttpServer::OnNewMessage(const TcpConnectionPtr& connection, Buffer* buffer)
{
	HttpContext* context =
			std::any_cast<HttpContext>(connection->GetContext("HttpContext"));

	bool parse_ok = context->ParseRequest(buffer);

	if (!parse_ok)
	{
		/**
		 * 解析失败直接简单粗暴返回错误 .... 可以可以 不分配多余的资源
		 */
		connection->Send("HTTP/1.1 400 Bad Request\r\n\r\n");
		connection->DestroyConnection();
	}

	if (context->ParseOver())
	{
		OnHttpRequest(connection, context->GetRequest());
		context->Reset();
	}
}